

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SGP4.cc
# Opt level: O0

void libsgp4::SGP4::DeepSpaceSecular
               (double tsince,OrbitalElements *elements,CommonConstants *c_constants,
               DeepSpaceConstants *ds_constants,IntegratorParams *integ_params,double *xll,
               double *omgasm,double *xnodes,double *em,double *xinc,double *xn)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  bool bVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double theta;
  double xl_temp;
  double delt;
  double ft;
  double x2li;
  double x2omi;
  double xomi;
  bool running;
  double xldot;
  double xnddt;
  double xndot;
  double *omgasm_local;
  double *xll_local;
  IntegratorParams *integ_params_local;
  DeepSpaceConstants *ds_constants_local;
  CommonConstants *c_constants_local;
  OrbitalElements *elements_local;
  double tsince_local;
  
  *xll = ds_constants->ssl * tsince + *xll;
  *omgasm = ds_constants->ssg * tsince + *omgasm;
  *xnodes = ds_constants->ssh * tsince + *xnodes;
  *em = ds_constants->sse * tsince + *em;
  *xinc = ds_constants->ssi * tsince + *xinc;
  if (ds_constants->shape != NONE) {
    if (((ABS(tsince) < 720.0) || (tsince * integ_params->atime <= 0.0)) ||
       (ABS(tsince) < ABS(integ_params->atime))) {
      integ_params->atime = 0.0;
      dVar6 = OrbitalElements::RecoveredMeanMotion(elements);
      integ_params->xni = dVar6;
      integ_params->xli = ds_constants->xlamo;
    }
    bVar5 = true;
    while (bVar5) {
      if (ds_constants->shape == SYNCHRONOUS) {
        dVar6 = ds_constants->del1;
        dVar7 = sin(integ_params->xli - 0.13130908);
        dVar24 = ds_constants->del2;
        dVar8 = sin((integ_params->xli - 2.8843198) * 2.0);
        dVar1 = ds_constants->del3;
        dVar9 = sin((integ_params->xli - 0.37448087) * 3.0);
        xnddt = dVar1 * dVar9 + dVar6 * dVar7 + dVar24 * dVar8;
        dVar6 = ds_constants->del1;
        dVar7 = cos(integ_params->xli - 0.13130908);
        dVar24 = ds_constants->del2;
        dVar8 = cos((integ_params->xli - 2.8843198) * 2.0);
        dVar1 = ds_constants->del3;
        dVar9 = cos((integ_params->xli - 0.37448087) * 3.0);
        xldot = dVar1 * 3.0 * dVar9 + dVar6 * dVar7 + dVar24 * 2.0 * dVar8;
      }
      else {
        dVar10 = OrbitalElements::ArgumentPerigee(elements);
        dVar10 = c_constants->omgdot * integ_params->atime + dVar10;
        dVar11 = dVar10 + dVar10;
        dVar12 = integ_params->xli + integ_params->xli;
        dVar6 = ds_constants->d2201;
        dVar13 = sin((dVar11 + integ_params->xli) - 5.7686396);
        dVar24 = ds_constants->d2211;
        dVar14 = sin(integ_params->xli - 5.7686396);
        dVar1 = ds_constants->d3210;
        dVar15 = sin((dVar10 + integ_params->xli) - 0.95240898);
        dVar7 = ds_constants->d3222;
        dVar16 = sin((-dVar10 + integ_params->xli) - 0.95240898);
        dVar8 = ds_constants->d4410;
        dVar17 = sin((dVar11 + dVar12) - 1.8014998);
        dVar9 = ds_constants->d4422;
        dVar18 = sin(dVar12 - 1.8014998);
        dVar23 = ds_constants->d5220;
        dVar19 = sin((dVar10 + integ_params->xli) - 1.050833);
        dVar2 = ds_constants->d5232;
        dVar20 = sin((-dVar10 + integ_params->xli) - 1.050833);
        dVar3 = ds_constants->d5421;
        dVar21 = sin((dVar10 + dVar12) - 4.4108898);
        dVar4 = ds_constants->d5433;
        dVar22 = sin((-dVar10 + dVar12) - 4.4108898);
        xnddt = dVar4 * dVar22 +
                dVar3 * dVar21 +
                dVar2 * dVar20 +
                dVar23 * dVar19 +
                dVar9 * dVar18 +
                dVar8 * dVar17 + dVar7 * dVar16 + dVar1 * dVar15 + dVar6 * dVar13 + dVar24 * dVar14;
        dVar6 = ds_constants->d2201;
        dVar13 = cos((dVar11 + integ_params->xli) - 5.7686396);
        dVar24 = ds_constants->d2211;
        dVar14 = cos(integ_params->xli - 5.7686396);
        dVar1 = ds_constants->d3210;
        dVar15 = cos((dVar10 + integ_params->xli) - 0.95240898);
        dVar7 = ds_constants->d3222;
        dVar16 = cos((-dVar10 + integ_params->xli) - 0.95240898);
        dVar8 = ds_constants->d5220;
        dVar17 = cos((dVar10 + integ_params->xli) - 1.050833);
        dVar9 = ds_constants->d5232;
        dVar18 = cos((-dVar10 + integ_params->xli) - 1.050833);
        dVar23 = ds_constants->d4410;
        dVar11 = cos((dVar11 + dVar12) - 1.8014998);
        dVar2 = ds_constants->d4422;
        dVar19 = cos(dVar12 - 1.8014998);
        dVar3 = ds_constants->d5421;
        dVar20 = cos((dVar10 + dVar12) - 4.4108898);
        dVar4 = ds_constants->d5433;
        dVar10 = cos((-dVar10 + dVar12) - 4.4108898);
        dVar23 = dVar4 * dVar10 + dVar3 * dVar20 + dVar23 * dVar11 + dVar2 * dVar19;
        xldot = dVar23 + dVar23 +
                dVar9 * dVar18 +
                dVar8 * dVar17 + dVar7 * dVar16 + dVar1 * dVar15 + dVar6 * dVar13 + dVar24 * dVar14;
      }
      dVar6 = integ_params->xni + ds_constants->xfact;
      dVar24 = tsince - integ_params->atime;
      if (ABS(dVar24) < 720.0) {
        *xn = dVar6 * xldot * dVar24 * dVar24 * 0.5 + xnddt * dVar24 + integ_params->xni;
        dVar6 = xnddt * dVar24 * dVar24 * 0.5 + dVar6 * dVar24 + integ_params->xli;
        dVar24 = Util::WrapTwoPI(tsince * 0.0043752690880113 + ds_constants->gsto);
        if (ds_constants->shape == SYNCHRONOUS) {
          *xll = ((dVar6 + dVar24) - *xnodes) - *omgasm;
        }
        else {
          *xll = (dVar24 - *xnodes) + (dVar24 - *xnodes) + dVar6;
        }
        bVar5 = false;
      }
      else {
        dVar24 = (double)(~-(ulong)(0.0 <= dVar24) & 0xc086800000000000 |
                         -(ulong)(0.0 <= dVar24) & 0x4086800000000000);
        integ_params->xli = xnddt * 259200.0 + dVar6 * dVar24 + integ_params->xli;
        integ_params->xni = dVar6 * xldot * 259200.0 + xnddt * dVar24 + integ_params->xni;
        integ_params->atime = dVar24 + integ_params->atime;
      }
    }
  }
  return;
}

Assistant:

void SGP4::DeepSpaceSecular(
        const double tsince,
        const OrbitalElements& elements,
        const CommonConstants& c_constants,
        const DeepSpaceConstants& ds_constants,
        IntegratorParams& integ_params,
        double& xll,
        double& omgasm,
        double& xnodes,
        double& em,
        double& xinc,
        double& xn)
{
    static const double G22 = 5.7686396;
    static const double G32 = 0.95240898;
    static const double G44 = 1.8014998;
    static const double G52 = 1.0508330;
    static const double G54 = 4.4108898;
    static const double FASX2 = 0.13130908;
    static const double FASX4 = 2.8843198;
    static const double FASX6 = 0.37448087;

    static const double STEP = 720.0;
    static const double STEP2 = 259200.0;

    xll += ds_constants.ssl * tsince;
    omgasm += ds_constants.ssg * tsince;
    xnodes += ds_constants.ssh * tsince;
    em += ds_constants.sse * tsince;
    xinc += ds_constants.ssi * tsince;

    if (ds_constants.shape != DeepSpaceConstants::NONE)
    {
        double xndot = 0.0;
        double xnddt = 0.0;
        double xldot = 0.0;
        /*
         * 1st condition (if tsince is less than one time step from epoch)
         * 2nd condition (if atime and
         *     tsince are of opposite signs, so zero crossing required)
         * 3rd condition (if tsince is closer to zero than 
         *     atime, only integrate away from zero)
         */
        if (fabs(tsince) < STEP ||
            tsince * integ_params.atime <= 0.0 ||
            fabs(tsince) < fabs(integ_params.atime))
        {
            // restart back at the epoch
            integ_params.atime = 0.0;
            // TODO: check
            integ_params.xni = elements.RecoveredMeanMotion();
            // TODO: check
            integ_params.xli = ds_constants.xlamo;
        }

        bool running = true;
        while (running)
        {
            // always calculate dot terms ready for integration beginning
            // from the start of the range which is 'atime'
            if (ds_constants.shape == DeepSpaceConstants::SYNCHRONOUS)
            {
                xndot = ds_constants.del1 * sin(integ_params.xli - FASX2)
                    + ds_constants.del2 * sin(2.0 * (integ_params.xli - FASX4))
                    + ds_constants.del3 * sin(3.0 * (integ_params.xli - FASX6));
                xnddt = ds_constants.del1 * cos(integ_params.xli - FASX2)
                    + 2.0 * ds_constants.del2 * cos(2.0 * (integ_params.xli - FASX4))
                    + 3.0 * ds_constants.del3 * cos(3.0 * (integ_params.xli - FASX6));
            }
            else
            {
                // TODO: check
                const double xomi = elements.ArgumentPerigee() + c_constants.omgdot * integ_params.atime;
                const double x2omi = xomi + xomi;
                const double x2li = integ_params.xli + integ_params.xli;
                xndot = ds_constants.d2201 * sin(x2omi + integ_params.xli - G22)
                    + ds_constants.d2211 * sin(integ_params.xli - G22)
                    + ds_constants.d3210 * sin(xomi + integ_params.xli - G32)
                    + ds_constants.d3222 * sin(-xomi + integ_params.xli - G32)
                    + ds_constants.d4410 * sin(x2omi + x2li - G44)
                    + ds_constants.d4422 * sin(x2li - G44)
                    + ds_constants.d5220 * sin(xomi + integ_params.xli - G52)
                    + ds_constants.d5232 * sin(-xomi + integ_params.xli - G52)
                    + ds_constants.d5421 * sin(xomi + x2li - G54)
                    + ds_constants.d5433 * sin(-xomi + x2li - G54);
                xnddt = ds_constants.d2201 * cos(x2omi + integ_params.xli - G22)
                    + ds_constants.d2211 * cos(integ_params.xli - G22)
                    + ds_constants.d3210 * cos(xomi + integ_params.xli - G32)
                    + ds_constants.d3222 * cos(-xomi + integ_params.xli - G32)
                    + ds_constants.d5220 * cos(xomi + integ_params.xli - G52)
                    + ds_constants.d5232 * cos(-xomi + integ_params.xli - G52)
                    + 2.0 * (ds_constants.d4410 * cos(x2omi + x2li - G44)
                    + ds_constants.d4422 * cos(x2li - G44)
                    + ds_constants.d5421 * cos(xomi + x2li - G54)
                    + ds_constants.d5433 * cos(-xomi + x2li - G54));
            }
            xldot = integ_params.xni + ds_constants.xfact;
            xnddt *= xldot;

            double ft = tsince - integ_params.atime;
            if (fabs(ft) >= STEP)
            {
                const double delt = (ft >= 0.0 ? STEP : -STEP);
                // integrate by a full step ('delt'), updating the cached
                // values for the new 'atime'
                integ_params.xli = integ_params.xli + xldot * delt + xndot * STEP2;
                integ_params.xni = integ_params.xni + xndot * delt + xnddt * STEP2;
                integ_params.atime += delt;
            }
            else
            {
                // integrate by the difference 'ft' remaining
                xn = integ_params.xni + xndot * ft
                    + xnddt * ft * ft * 0.5;
                const double xl_temp = integ_params.xli + xldot * ft
                    + xndot * ft * ft * 0.5;

                const double theta = Util::WrapTwoPI(ds_constants.gsto + tsince * kTHDT);
                if (ds_constants.shape == DeepSpaceConstants::SYNCHRONOUS)
                {
                    xll = xl_temp + theta - xnodes - omgasm;
                }
                else
                {
                    xll = xl_temp + 2.0 * (theta - xnodes);
                }
                running = false;
            }
        }
    }
}